

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

string_t __thiscall
duckdb::WindowQuantileState<duckdb::string_t>::WindowScalar<duckdb::string_t,true>
          (WindowQuantileState<duckdb::string_t> *this,CursorType *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  bool bVar1;
  pointer this_00;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  InternalException *this_01;
  SubFrames *in_RDI;
  IndexError *idx_err;
  array<duckdb::string_t,_2UL> dest;
  Interpolator<true> interp;
  string_t *in_stack_fffffffffffffec8;
  Interpolator<true> *in_stack_fffffffffffffed0;
  allocator *paVar5;
  QuantileValue *in_stack_fffffffffffffed8;
  Interpolator<true> *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
  *in_stack_fffffffffffffef0;
  QuantileValue *in_stack_ffffffffffffff18;
  Vector *in_stack_ffffffffffffff20;
  idx_t in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  allocator in_stack_ffffffffffffff3f;
  QuantileSortTree *in_stack_ffffffffffffff40;
  anon_union_16_2_67f50693_for_value local_10;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
                      *)0xa53ab9);
  if (bVar1) {
    unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>::
    operator->((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
                *)in_stack_fffffffffffffed0);
    local_10.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         QuantileSortTree::WindowScalar<duckdb::string_t,duckdb::string_t,true>
                   (in_stack_ffffffffffffff40,
                    (QuantileCursor<duckdb::string_t> *)
                    CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),in_RDI,
                    in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_>_>
                        *)0xa53b1c);
    if (!bVar1) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      paVar5 = (allocator *)&stack0xffffffffffffff3f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff40,"No accelerator for scalar QUANTILE",paVar5);
      duckdb::InternalException::InternalException(this_01,(string *)&stack0xffffffffffffff40);
      __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
    }
    this_00 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_>,_true>
              ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_>,_true>
                            *)in_stack_fffffffffffffed0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
    ::size(this_00);
    Interpolator<true>::Interpolator
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(idx_t)in_stack_fffffffffffffed0,
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0));
    unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_>,_true>
    ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_>,_true>
                  *)in_stack_fffffffffffffed0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
    ::at(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0,
         (vector<std::pair<unsigned_long,_duckdb::string_t>,_std::allocator<std::pair<unsigned_long,_duckdb::string_t>_>_>
          *)in_stack_fffffffffffffed8);
    pvVar2 = vector<std::pair<unsigned_long,_duckdb::string_t>,_true>::operator[]
                       ((vector<std::pair<unsigned_long,_duckdb::string_t>,_true> *)
                        in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    pvVar3 = std::array<duckdb::string_t,_2UL>::operator[]
                       ((array<duckdb::string_t,_2UL> *)in_stack_fffffffffffffed0,
                        (size_type)in_stack_fffffffffffffec8);
    *(undefined8 *)&pvVar3->value = *(undefined8 *)&(pvVar2->second).value;
    (pvVar3->value).pointer.ptr = (pvVar2->second).value.pointer.ptr;
    sVar4 = std::
            vector<std::pair<unsigned_long,_duckdb::string_t>,_std::allocator<std::pair<unsigned_long,_duckdb::string_t>_>_>
            ::size((vector<std::pair<unsigned_long,_duckdb::string_t>,_std::allocator<std::pair<unsigned_long,_duckdb::string_t>_>_>
                    *)&in_RDI[1].
                       super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                       super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar4 < 2) {
      pvVar2 = vector<std::pair<unsigned_long,_duckdb::string_t>,_true>::operator[]
                         ((vector<std::pair<unsigned_long,_duckdb::string_t>,_true> *)
                          in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
      pvVar3 = std::array<duckdb::string_t,_2UL>::operator[]
                         ((array<duckdb::string_t,_2UL> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      *(undefined8 *)&pvVar3->value = *(undefined8 *)&(pvVar2->second).value;
      (pvVar3->value).pointer.ptr = (pvVar2->second).value.pointer.ptr;
    }
    else {
      pvVar2 = vector<std::pair<unsigned_long,_duckdb::string_t>,_true>::operator[]
                         ((vector<std::pair<unsigned_long,_duckdb::string_t>,_true> *)
                          in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
      pvVar3 = std::array<duckdb::string_t,_2UL>::operator[]
                         ((array<duckdb::string_t,_2UL> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      *(undefined8 *)&pvVar3->value = *(undefined8 *)&(pvVar2->second).value;
      (pvVar3->value).pointer.ptr = (pvVar2->second).value.pointer.ptr;
    }
    std::array<duckdb::string_t,_2UL>::data((array<duckdb::string_t,_2UL> *)0xa53d24);
    local_10.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         Interpolator<true>::Extract<duckdb::string_t,duckdb::string_t>
                   (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(Vector *)0xa53d3c);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}